

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall djb::npf::eval(npf *this,vec3 *dirIn,vec3 *dirOut,void *param_3)

{
  double dVar1;
  double dVar2;
  float *extraout_RDX;
  float *pfVar3;
  float *extraout_RDX_00;
  int x;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float fVar7;
  float fVar8;
  float fVar9;
  vec3 vVar10;
  vec3 vVar11;
  vec3 vVar12;
  vec3 vVar13;
  vec3 vVar14;
  vec3 vVar15;
  value_type vVar16;
  initializer_list<float> __l;
  float local_c8;
  float fStack_c4;
  float_t nrm;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  vec2 local_68;
  undefined8 local_60;
  float local_58;
  vec3 local_50;
  vec3 local_40;
  
  if ((0.0 < dirOut->z || dirOut->z == 0.0) &&
     (0.0 < *(float *)((long)param_3 + 8) || *(float *)((long)param_3 + 8) == 0.0)) {
    vVar10 = operator+(dirOut,(vec3 *)param_3);
    fVar8 = vVar10.z;
    fVar6 = vVar10.x;
    fVar5 = vVar10.y;
    nrm = fVar8 * fVar8 + fVar6 * fVar6 + fVar5 * fVar5;
    if ((nrm != 0.0) || (NAN(nrm))) {
      fVar4 = inversesqrt<float>(&nrm);
      fVar7 = fVar6 * fVar4 * 0.0 + fVar5 * fVar4 * 0.0 + fVar8 * fVar4;
      fVar9 = 0.0;
      if (0.0 <= fVar7) {
        fVar9 = fVar7;
      }
      fVar7 = 1.0;
      if (fVar9 <= 1.0) {
        fVar7 = fVar9;
      }
      local_a8._0_4_ = acosf(fVar7);
      fVar5 = fVar8 * fVar4 * dirOut->z + fVar6 * fVar4 * dirOut->x + fVar5 * fVar4 * dirOut->y;
      fVar6 = 0.0;
      if (0.0 <= fVar5) {
        fVar6 = fVar5;
      }
      fVar5 = 1.0;
      if (fVar6 <= 1.0) {
        fVar5 = fVar6;
      }
      local_98._0_4_ = acosf(fVar5);
      fVar5 = dirOut->x * 0.0 + dirOut->y * 0.0 + dirOut->z;
      fVar6 = 0.0;
      if (0.0 <= fVar5) {
        fVar6 = fVar5;
      }
      fVar5 = 1.0;
      if (fVar6 <= 1.0) {
        fVar5 = fVar6;
      }
      fVar5 = acosf(fVar5);
      fVar8 = *param_3 * 0.0 + *(float *)((long)param_3 + 4) * 0.0 + *(float *)((long)param_3 + 8);
      fVar6 = 0.0;
      if (0.0 <= fVar8) {
        fVar6 = fVar8;
      }
      fVar8 = 1.0;
      if (fVar6 <= 1.0) {
        fVar8 = fVar6;
      }
      fVar6 = acosf(fVar8);
      local_68.y = (float)(int)dirIn[2].z * 0.00390625;
      local_68.x = 0.0;
      vVar10 = uberTextureLookup((npf *)dirIn,&local_68);
      local_78._8_4_ = extraout_XMM0_Dc;
      local_78._0_8_ = vVar10._0_8_;
      local_78._12_4_ = extraout_XMM0_Dd;
      local_68.x = 0.001953125;
      vVar11 = uberTextureLookup((npf *)dirIn,&local_68);
      local_88._8_4_ = extraout_XMM0_Dc_00;
      local_88._0_8_ = vVar11._0_8_;
      local_88._12_4_ = extraout_XMM0_Dd_00;
      dVar1 = ((double)(float)local_a8._0_4_ / 3.141592653589793) * 0.5 * 90.0 * 90.0;
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      dVar2 = 0.0;
      if (0.0 <= dVar1) {
        dVar2 = dVar1;
      }
      dVar1 = 89.0;
      if (dVar2 <= 89.0) {
        dVar1 = dVar2;
      }
      x = (int)dVar1 + 2;
      if (*(char *)&dirIn[3].x == '\x01') {
        printf("iD: %i\n");
      }
      vVar12 = uberTextureLookupInt((npf *)dirIn,x);
      local_a8._8_4_ = extraout_XMM0_Dc_01;
      local_a8._0_8_ = vVar12._0_8_;
      local_a8._12_4_ = extraout_XMM0_Dd_01;
      vVar13 = lookupInterpolatedG1((npf *)dirIn,x,fVar5);
      local_40.z = vVar13.z;
      local_40._0_8_ = vVar13._0_8_;
      vVar13 = lookupInterpolatedG1((npf *)dirIn,x,fVar6);
      local_50.z = vVar13.z;
      local_50._0_8_ = vVar13._0_8_;
      dVar1 = ((double)(float)local_98._0_4_ / 3.141592653589793) * 0.5 * 90.0;
      dVar2 = 0.0;
      if (0.0 <= dVar1) {
        dVar2 = dVar1;
      }
      dVar1 = 89.0;
      if (dVar2 <= 89.0) {
        dVar1 = dVar2;
      }
      vVar13 = uberTextureLookupInt((npf *)dirIn,(int)dVar1 + 0xb6);
      local_98._8_4_ = extraout_XMM0_Dc_02;
      local_98._0_8_ = vVar13._0_8_;
      local_98._12_4_ = extraout_XMM0_Dd_02;
      fVar5 = cosf(fVar5);
      vVar14 = operator/(&local_40,fVar5);
      fVar6 = cosf(fVar6);
      vVar15 = operator/(&local_50,fVar6);
      fVar6 = *(float *)((long)param_3 + 8);
      local_c8 = vVar14.x;
      fStack_c4 = vVar14.y;
      fVar5 = fVar6 * ((float)local_78._0_4_ +
                      (float)local_88._0_4_ * (float)local_a8._0_4_ * (float)local_98._0_4_ *
                      local_c8 * vVar15.x) * 0.0625;
      fVar8 = fVar6 * ((float)local_78._4_4_ +
                      (float)local_88._4_4_ * (float)local_a8._4_4_ * (float)local_98._4_4_ *
                      fStack_c4 * vVar15.y) * 0.0625;
      local_58 = (vVar10.z + vVar15.z * vVar14.z * vVar11.z * vVar12.z * vVar13.z) * fVar6 * 0.0625;
      *(undefined1 *)&dirIn[3].x = 0;
      fVar6 = local_58 * local_58 + fVar5 * fVar5 + fVar8 * fVar8;
      if ((!NAN(fVar6)) && (ABS(fVar6) <= 10000.0)) {
        local_60 = CONCAT44(fVar8,fVar5);
        __l._M_len = 3;
        __l._M_array = (iterator)&local_60;
        std::valarray<float>::valarray((valarray<float> *)this,__l);
        pfVar3 = extraout_RDX_00;
        goto LAB_0014824b;
      }
    }
  }
  (**(code **)(*(long *)dirIn + 0x10))(this,dirIn);
  pfVar3 = extraout_RDX;
LAB_0014824b:
  vVar16._M_data = pfVar3;
  vVar16._M_size = (size_t)this;
  return vVar16;
}

Assistant:

brdf::value_type npf::eval(const vec3 &dirIn, const vec3 &dirOut, const void *) const
{
	if (dirIn.z < 0 || dirOut.z < 0)
		return zero_value();

	vec3 tmp = dirIn + dirOut;
	float_t nrm = dot(tmp, tmp);

	if (nrm == 0)
		return zero_value();
	vec3 dirNormal = vec3(0, 0, 1);
	vec3 dirH = tmp * inversesqrt(nrm);
	float thetaH = acos(sat(dot(dirH, dirNormal)));
	float thetaD = acos(sat(dot(dirIn, dirH)));
	float thetaI = acos(sat(dot(dirIn, dirNormal)));
	float thetaO = acos(sat(dot(dirOut, dirNormal)));

	// BRDF texture has a fixed size of 512x256
	vec2 uv;
	uv.y = float(m_id)/256.;

	uv.x = 0.0/512.;
	vec3 rhoD = uberTextureLookup(uv);
	//if (m_first) printf("%f %f %f\n", rhoD.x, rhoD.y, rhoD.z); //OK

	uv.x = 1.0/512.;
	vec3 rhoS = uberTextureLookup(uv);
	//if (m_first) printf("%f %f %f\n", rhoS.x, rhoS.y, rhoS.z); //OK

	int iD = int(clamp(sqrt(thetaH / M_PI / 2
	             * 90.0 * 90.0), 0.0, 89.0));
	uv.x = float(iD+2)/512.;
	if (m_first)
		printf("iD: %i\n", iD);
	vec3 D = uberTextureLookup(uv);
	D = uberTextureLookupInt(iD+2); //OK

	vec3 G1I = lookupInterpolatedG1(m_id, thetaI);

	vec3 G1O = lookupInterpolatedG1(m_id, thetaO);

	auto tmp2 = thetaD / M_PI / 2 * 90.0;
	int iF = int(clamp(tmp2, 0.0, 89.0));
	uv.x = float(iF+2+90+90)/512.;
	vec3 F = uberTextureLookup(uv);
	F = uberTextureLookupInt(iF+2+90+90); //OK

	vec3 BRDF = (rhoD) + (rhoS) * D * F *
	            (G1I / cos(thetaI)) * (G1O / cos(thetaO));
	BRDF*= dirOut.z;
	BRDF*= 1.0 / 16;

	m_first = false;

	if (fabs(dot(BRDF, BRDF)) > 9999.9999f || std::isnan(dot(BRDF, BRDF))) {
		return zero_value();
	}

	return brdf::value_type({BRDF.x, BRDF.y, BRDF.z});
}